

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O3

void pbrt::detail::
     stringPrintfRecursive<bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
               (string *s,char *fmt,bool *v,float *args,float *args_1,float *args_2,float *args_3,
               float *args_4,float *args_5)

{
  _Alloc_hider _Var1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char *s_00;
  char cVar7;
  string str;
  string nextFmt;
  char *fmt_local;
  
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  cVar7 = (char)&nextFmt;
  lVar3 = std::__cxx11::string::find(cVar7,0x2a);
  lVar4 = std::__cxx11::string::find(cVar7,0x73);
  lVar5 = std::__cxx11::string::find(cVar7,100);
  _Var1 = nextFmt._M_dataplus;
  if (lVar3 != -1) {
    s_00 = "MEH";
    iVar2 = 0xbe;
LAB_0041a346:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
             ,iVar2,s_00);
  }
  if (lVar4 == -1) {
    if (lVar5 == -1) {
      if (nextFmt._M_string_length == 0) {
        s_00 = "Excess values passed to Printf.";
        iVar2 = 0x10d;
        goto LAB_0041a346;
      }
      iVar2 = snprintf((char *)0x0,0,nextFmt._M_dataplus._M_p,(ulong)*v);
      str._M_dataplus._M_p = (pointer)&str.field_2;
      str._M_string_length = 0;
      str.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::resize((ulong)&str,(char)(iVar2 + 1));
      snprintf(str._M_dataplus._M_p,(long)(iVar2 + 1),_Var1._M_p,(ulong)*v);
      std::__cxx11::string::pop_back();
      std::__cxx11::string::_M_append((char *)s,(ulong)str._M_dataplus._M_p);
    }
    else {
      uVar6 = std::__cxx11::string::find((char)&nextFmt,100);
      std::__cxx11::string::replace((ulong)&nextFmt,uVar6,(char *)0x1,0x7a43fe);
      _Var1 = nextFmt._M_dataplus;
      iVar2 = snprintf((char *)0x0,0,nextFmt._M_dataplus._M_p,(ulong)*v);
      str._M_dataplus._M_p = (pointer)&str.field_2;
      str._M_string_length = 0;
      str.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::resize((ulong)&str,(char)(iVar2 + 1));
      snprintf(str._M_dataplus._M_p,(long)(iVar2 + 1),_Var1._M_p,(ulong)*v);
      std::__cxx11::string::pop_back();
      std::__cxx11::string::_M_append((char *)s,(ulong)str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p,
                      CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0])
                      + 1);
    }
  }
  else {
    std::__cxx11::string::append((char *)s);
  }
  stringPrintfRecursive<float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
            (s,fmt_local,args,args_1,args_2,args_3,args_4,args_5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nextFmt._M_dataplus._M_p != &nextFmt.field_2) {
    operator_delete(nextFmt._M_dataplus._M_p,nextFmt.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}